

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

uint32_t syn_data_abort_with_iss
                   (int same_el,int sas,int sse,int srt,int sf,int ar,int ea,int cm,int s1ptw,
                   int wnr,int fsc,_Bool is_16bit)

{
  uint uVar1;
  _Bool is_16bit_local;
  int ar_local;
  int sf_local;
  int srt_local;
  int sse_local;
  int sas_local;
  int same_el_local;
  
  uVar1 = 0x2000000;
  if (is_16bit) {
    uVar1 = 0;
  }
  return same_el << 0x1a | 0x90000000U | uVar1 | 0x1000000 | sas << 0x16 | sse << 0x15 | srt << 0x10
         | sf << 0xf | ar << 0xe | ea << 9 | cm << 8 | s1ptw << 7 | wnr << 6 | fsc;
}

Assistant:

static inline uint32_t syn_data_abort_with_iss(int same_el,
                                               int sas, int sse, int srt,
                                               int sf, int ar,
                                               int ea, int cm, int s1ptw,
                                               int wnr, int fsc,
                                               bool is_16bit)
{
    return ( (uint32_t)EC_DATAABORT << ARM_EL_EC_SHIFT) | ( (uint32_t)same_el << ARM_EL_EC_SHIFT)
           | (is_16bit ? 0 : ARM_EL_IL)
           | ARM_EL_ISV | (sas << 22) | (sse << 21) | (srt << 16)
           | (sf << 15) | (ar << 14)
           | (ea << 9) | (cm << 8) | (s1ptw << 7) | (wnr << 6) | fsc;
}